

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O0

UBool __thiscall icu_63::BMPSet::contains(BMPSet *this,UChar32 c)

{
  uint uVar1;
  int iVar2;
  uint32_t twoBits;
  int lead;
  UChar32 c_local;
  BMPSet *this_local;
  
  if ((uint)c < 0x100) {
    this_local._7_1_ = this->latin1Contains[c];
  }
  else if ((uint)c < 0x800) {
    this_local._7_1_ = (this->table7FF[(int)(c & 0x3f)] & 1 << ((byte)(c >> 6) & 0x1f)) != 0;
  }
  else if (((uint)c < 0xd800) || ((0xdfff < c && (c < 0x10000)))) {
    iVar2 = c >> 0xc;
    uVar1 = this->bmpBlockBits[(int)(c >> 6 & 0x3f)] >> ((byte)iVar2 & 0x1f) & 0x10001;
    if (uVar1 < 2) {
      this_local._7_1_ = (UBool)uVar1;
    }
    else {
      this_local._7_1_ =
           containsSlow(this,c,this->list4kStarts[iVar2],this->list4kStarts[iVar2 + 1]);
    }
  }
  else if ((uint)c < 0x110000) {
    this_local._7_1_ = containsSlow(this,c,this->list4kStarts[0xd],this->list4kStarts[0x11]);
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
BMPSet::contains(UChar32 c) const {
    if((uint32_t)c<=0xff) {
        return (UBool)latin1Contains[c];
    } else if((uint32_t)c<=0x7ff) {
        return (UBool)((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0);
    } else if((uint32_t)c<0xd800 || (c>=0xe000 && c<=0xffff)) {
        int lead=c>>12;
        uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
        if(twoBits<=1) {
            // All 64 code points with the same bits 15..6
            // are either in the set or not.
            return (UBool)twoBits;
        } else {
            // Look up the code point in its 4k block of code points.
            return containsSlow(c, list4kStarts[lead], list4kStarts[lead+1]);
        }
    } else if((uint32_t)c<=0x10ffff) {
        // surrogate or supplementary code point
        return containsSlow(c, list4kStarts[0xd], list4kStarts[0x11]);
    } else {
        // Out-of-range code points get FALSE, consistent with long-standing
        // behavior of UnicodeSet::contains(c).
        return FALSE;
    }
}